

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseFilters::TestCaseFilters(TestCaseFilters *this,TestCaseFilters *param_2)

{
  long in_RSI;
  long in_RDI;
  vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *in_stack_00000008;
  vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *in_stack_00000010;
  
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::vector
            (in_stack_00000010,in_stack_00000008);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
             in_stack_00000010,
             (vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
             in_stack_00000008);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
             in_stack_00000010,
             (vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
             in_stack_00000008);
  std::__cxx11::string::string((string *)(in_RDI + 0x48),(string *)(in_RSI + 0x48));
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}